

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O1

void __thiscall
QPDFFormFieldObjectHelper::setRadioButtonValue
          (QPDFFormFieldObjectHelper *this,QPDFObjectHandle *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 this_00;
  bool bVar2;
  __index_type _Var3;
  bool bVar4;
  bool bVar5;
  iterator key;
  iterator iVar6;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar7;
  iterator iVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  QPDFFormFieldObjectHelper ph;
  QPDFObjectHandle annot;
  QPDFObjectHandle AP;
  QPDFObjectHandle parent;
  QPDFObjectHandle kids;
  QPDFFormFieldObjectHelper local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  string local_1b8;
  undefined1 local_198 [16];
  undefined1 local_188 [32];
  QPDFObjectHandle local_168;
  undefined1 local_158 [24];
  undefined1 local_140 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  string local_118;
  long *local_f8 [2];
  long local_e8 [2];
  QPDFObjectHandle local_d8;
  QPDFObjectHandle local_c8;
  QPDFObjectHandle local_b8;
  QPDFFormFieldObjectHelper *local_a8;
  QPDFObjectHandle *local_a0;
  QPDFObjectHandle local_98;
  Array local_88;
  QPDFObjectHandle local_70;
  string local_60;
  QPDFObjectHandle local_40;
  
  local_118._M_dataplus._M_p =
       (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_118._M_string_length =
       (size_type)
       (this->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length)->
           _M_use_count + 1;
    }
  }
  p_Var1 = &local_1f8.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/Parent","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_140,&local_118);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
    operator_delete(local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (ulong)((long)&(local_1f8.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length);
  }
  bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_140);
  if (bVar2) {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/Parent","");
    QPDFObjectHandle::getKey(&local_70,(string *)local_140);
    bVar2 = QPDFObjectHandle::isNull(&local_70);
    if (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
  }
  if (bVar2 != false) {
    local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_140._0_8_;
    local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_;
    if ((QPDFObjGen)local_140._8_8_ != (QPDFObjGen)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_140._8_8_ + 8) = *(_Atomic_word *)(local_140._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_140._8_8_ + 8) = *(_Atomic_word *)(local_140._8_8_ + 8) + 1;
      }
    }
    QPDFFormFieldObjectHelper(&local_1f8,&local_b8);
    if ((QPDFObjGen)
        local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (QPDFObjGen)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    bVar2 = isRadioButton(&local_1f8);
    if (bVar2) {
      local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (name->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (name->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_c8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_c8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      setRadioButtonValue(&local_1f8,&local_c8);
      if (local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      ~QPDFFormFieldObjectHelper(&local_1f8);
      if (bVar2) goto LAB_0016f0f2;
    }
    else {
      ~QPDFFormFieldObjectHelper(&local_1f8);
    }
  }
  local_1b8._M_dataplus._M_p =
       (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1b8._M_string_length =
       (size_type)
       (this->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length)->
           _M_use_count + 1;
    }
  }
  local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/Kids","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_140 + 0x18),&local_1b8);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
    operator_delete(local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (ulong)((long)&(local_1f8.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length);
  }
  bVar2 = isRadioButton(this);
  if (((bVar2) && (bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_140), bVar2)) &&
     (bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)(local_140 + 0x18)), bVar2)) {
    local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/V","");
    local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (name->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (name->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_d8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_d8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    setFieldAttribute(this,(string *)&local_1f8,&local_d8);
    if (local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
      operator_delete(local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (ulong)((long)&(local_1f8.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_140._24_8_;
    local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_120;
    if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_120->_M_use_count = local_120->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_120->_M_use_count = local_120->_M_use_count + 1;
      }
    }
    local_88.sp_elements._M_t.
    super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
    .
    super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
            )0x0;
    local_140._16_8_ = name;
    key = ::qpdf::Array::begin(&local_88);
    local_a8 = this;
    iVar6 = ::qpdf::Array::end(&local_88);
    if (key._M_current != iVar6._M_current) {
      local_1c0 = &local_1b8.field_2;
      local_158._16_8_ = local_e8;
      local_a0 = (QPDFObjectHandle *)iVar6;
      do {
        local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/AP","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_158,(string *)key._M_current);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
          operator_delete(local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)&(local_1f8.super_QPDFObjectHelper.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
        local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((element_type *)local_158._0_8_ == (element_type *)0x0) {
LAB_0016f27f:
          local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/Kids","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_188 + 0x10),(string *)key._M_current);
          local_198._0_8_ = local_188._16_8_;
          local_198._8_8_ = local_188._24_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_188._24_8_ + 8) = *(_Atomic_word *)(local_188._24_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_188._24_8_ + 8) = *(_Atomic_word *)(local_188._24_8_ + 8) + 1;
            }
          }
          local_188._0_8_ = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)0x0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._24_8_);
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
            operator_delete(local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                            (ulong)((long)&(local_1f8.super_QPDFObjectHelper.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
          }
          iVar6 = ::qpdf::Array::begin((Array *)local_198);
          iVar8 = ::qpdf::Array::end((Array *)local_198);
          for (; iVar6._M_current != iVar8._M_current;
              iVar6._M_current = (QPDFObjectHandle *)&((string *)iVar6._M_current)->field_2) {
            local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/AP","");
            QPDFObjectHandle::getKey
                      ((QPDFObjectHandle *)(local_188 + 0x10),(string *)iVar6._M_current);
            this_00 = local_158._8_8_;
            local_158._8_8_ = local_188._24_8_;
            local_158._0_8_ = local_188._16_8_;
            local_188._16_8_ = (element_type *)0x0;
            local_188._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._24_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._24_8_);
            }
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
              operator_delete(local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                              (ulong)((long)&(local_1f8.super_QPDFObjectHelper.super_BaseHandle.obj.
                                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
            }
            if ((element_type *)local_158._0_8_ != (element_type *)0x0) {
              _Var3 = *(__index_type *)(local_158._0_8_ + 0x30);
              if (_Var3 == '\x0f') {
                pvVar7 = std::
                         get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                                   ((variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     *)local_158._0_8_);
LAB_0016f419:
                _Var3 = *(__index_type *)
                         ((long)&(((pvVar7->obj).
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                  )->value).
                                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                         + 0x30);
              }
              else if (_Var3 == '\r') {
                pvVar7 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                          *)QPDF::resolve(*(QPDF **)(local_158._0_8_ + 0x48),
                                          *(QPDFObjGen *)(local_158._0_8_ + 0x50));
                goto LAB_0016f419;
              }
              if (_Var3 != '\x02') {
                local_168.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)(((string *)iVar6._M_current)->_M_dataplus)._M_p;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          (&local_168.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                           (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &((string *)iVar6._M_current)->_M_string_length);
                break;
              }
            }
          }
          std::
          unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
          ::~unique_ptr((unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                         *)local_188);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
          }
        }
        else {
          _Var3 = *(__index_type *)(local_158._0_8_ + 0x30);
          if (_Var3 == '\x0f') {
            pvVar7 = std::
                     get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                               ((variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 *)local_158._0_8_);
LAB_0016f275:
            _Var3 = *(__index_type *)
                     ((long)&(((pvVar7->obj).
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             value).
                             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     + 0x30);
          }
          else if (_Var3 == '\r') {
            pvVar7 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                      *)QPDF::resolve(*(QPDF **)(local_158._0_8_ + 0x48),
                                      *(QPDFObjGen *)(local_158._0_8_ + 0x50));
            goto LAB_0016f275;
          }
          if (_Var3 == '\x02') goto LAB_0016f27f;
          local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)(((string *)key._M_current)->_M_dataplus)._M_p;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_168.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &((string *)key._M_current)->_M_string_length);
        }
        if (local_168.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
           ) {
          local_198._0_8_ =
               (local_a8->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_198._8_8_ =
               (local_a8->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_)->_M_use_count +
                   1;
            }
          }
          local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f8,"unable to set the value of this radio button","");
          QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_198,(string *)&local_1f8);
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
            operator_delete(local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                            (ulong)((long)&(local_1f8.super_QPDFObjectHelper.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
          }
        }
        else {
          bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_158);
          if (bVar2) {
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"/N","");
            QPDFObjectHandle::getKey(&local_40,(string *)local_158);
            bVar4 = QPDFObjectHandle::isDictionary(&local_40);
            if (!bVar4) goto LAB_0016f54a;
            local_f8[0] = local_e8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"/N","");
            QPDFObjectHandle::getKey(&local_98,(string *)local_158);
            QPDFObjectHandle::getName_abi_cxx11_(&local_60,(QPDFObjectHandle *)local_140._16_8_);
            bVar5 = QPDFObjectHandle::hasKey(&local_98,&local_60);
            bVar4 = true;
          }
          else {
LAB_0016f54a:
            bVar4 = false;
            bVar5 = false;
          }
          if (bVar4) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if (local_98.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_98.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if (local_f8[0] != local_e8) {
              operator_delete(local_f8[0],local_e8[0] + 1);
            }
          }
          if (bVar2) {
            if (local_40.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_40.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (bVar5 == false) {
            local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/AS","");
            local_198._0_8_ = local_188;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"/Off","");
            QPDFObjectHandle::newName((QPDFObjectHandle *)(local_188 + 0x10),(string *)local_198);
            QPDFObjectHandle::replaceKey
                      (&local_168,(string *)&local_1f8,(QPDFObjectHandle *)(local_188 + 0x10));
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._24_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._24_8_);
            }
            if ((element_type *)local_198._0_8_ != (element_type *)local_188) {
              operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
            }
          }
          else {
            local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/AS","");
            QPDFObjectHandle::replaceKey
                      (&local_168,(string *)&local_1f8,(QPDFObjectHandle *)local_140._16_8_);
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
            operator_delete(local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                            (ulong)((long)&(local_1f8.super_QPDFObjectHelper.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
          }
        }
        if (local_168.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_168.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
        }
        key._M_current = (QPDFObjectHandle *)&((string *)key._M_current)->field_2;
      } while (key._M_current != local_a0);
    }
    std::
    unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
    ::~unique_ptr(&local_88.sp_elements);
    this_01._M_pi =
         local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  else {
    local_1b8._M_dataplus._M_p =
         (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1b8._M_string_length =
         (size_type)
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length)->
             _M_use_count + 1;
      }
    }
    local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,
               "don\'t know how to set the value of this field as a radio button","");
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&local_1b8,(string *)&local_1f8);
    this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
      operator_delete(local_1f8.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (ulong)((long)&(local_1f8.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length;
    }
  }
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
LAB_0016f0f2:
  if ((QPDFObjGen)local_140._8_8_ != (QPDFObjGen)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_);
  }
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::setRadioButtonValue(QPDFObjectHandle name)
{
    // Set the value of a radio button field. This has the following specific behavior:
    // * If this is a radio button field that has a parent that is also a radio button field and has
    //   no explicit /V, call itself on the parent
    // * If this is a radio button field with children, set /V to the given value. Then, for each
    //   child, if the child has the specified value as one of its keys in the /N subdictionary of
    //   its /AP (i.e. its normal appearance stream dictionary), set /AS to name; otherwise, if /Off
    //   is a member, set /AS to /Off.
    // Note that we never turn on /NeedAppearances when setting a radio button field.
    QPDFObjectHandle parent = oh().getKey("/Parent");
    if (parent.isDictionary() && parent.getKey("/Parent").isNull()) {
        QPDFFormFieldObjectHelper ph(parent);
        if (ph.isRadioButton()) {
            // This is most likely one of the individual buttons. Try calling on the parent.
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper set parent radio button");
            ph.setRadioButtonValue(name);
            return;
        }
    }

    QPDFObjectHandle kids = oh().getKey("/Kids");
    if (!(isRadioButton() && parent.isNull() && kids.isArray())) {
        oh().warnIfPossible("don't know how to set the value of this field as a radio button");
        return;
    }
    setFieldAttribute("/V", name);
    for (auto const& kid: kids.as_array()) {
        QPDFObjectHandle AP = kid.getKey("/AP");
        QPDFObjectHandle annot;
        if (AP.null()) {
            // The widget may be below. If there is more than one, just find the first one.
            for (auto const& grandkid: kid.getKey("/Kids").as_array()) {
                AP = grandkid.getKey("/AP");
                if (!AP.null()) {
                    QTC::TC("qpdf", "QPDFFormFieldObjectHelper radio button grandkid");
                    annot = grandkid;
                    break;
                }
            }
        } else {
            annot = kid;
        }
        if (!annot) {
            QTC::TC("qpdf", "QPDFObjectHandle broken radio button");
            oh().warnIfPossible("unable to set the value of this radio button");
            continue;
        }
        if (AP.isDictionary() && AP.getKey("/N").isDictionary() &&
            AP.getKey("/N").hasKey(name.getName())) {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper turn on radio button");
            annot.replaceKey("/AS", name);
        } else {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper turn off radio button");
            annot.replaceKey("/AS", QPDFObjectHandle::newName("/Off"));
        }
    }
}